

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadServiceWrapperBase.cpp
# Opt level: O3

bool __thiscall ThreadServiceWrapperBase::ScheduleNextCollectOnExit(ThreadServiceWrapperBase *this)

{
  uint uVar1;
  Recycler *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  DWORD DVar5;
  DWORD DVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  char16_t *pcVar9;
  
  if (this->threadContext->callRootLevel != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadServiceWrapperBase.cpp"
                       ,0xc0,"(!threadContext->IsInScript())","!threadContext->IsInScript()");
    if (!bVar3) goto LAB_007c989c;
    *puVar8 = 0;
  }
  if ((this->needIdleCollect == true) && (this->hasScheduledIdleCollect == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadServiceWrapperBase.cpp"
                       ,0xc1,"(!needIdleCollect || hasScheduledIdleCollect)",
                       "!needIdleCollect || hasScheduledIdleCollect");
    if (!bVar3) {
LAB_007c989c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  this_00 = this->threadContext->recycler;
  Memory::Recycler::FinishConcurrent<(Memory::CollectionFlags)270008320>(this_00);
  bVar3 = this->needIdleCollect;
  if (((this->forceIdleCollectOnce == true) && (DAT_015bc46a == '\x01')) &&
     (bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,IdleCollectPhase), bVar4)) {
    DVar5 = GetCurrentThreadId();
    Output::Print(L"%04X> Need to force one idle collection\n",(ulong)DVar5);
    Output::Flush();
  }
  if (this->forceIdleCollectOnce == false) {
    bVar4 = Memory::Recycler::ShouldIdleCollectOnExit(this_00);
    this->needIdleCollect = bVar4;
    if (bVar4) goto LAB_007c9729;
    if ((DAT_015bc46a == '\x01') &&
       (bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,IdleCollectPhase), bVar4)) {
      DVar5 = GetCurrentThreadId();
      pcVar9 = L"not scheduled";
      if (bVar3 != false) {
        pcVar9 = L"cancelled";
      }
      Output::Print(L"%04X> Idle on exit collect %s\n",(ulong)DVar5,pcVar9);
      Output::Flush();
    }
    BVar7 = Memory::Recycler::CollectionInProgress(this_00);
    if (BVar7 == 0) {
      return true;
    }
    if ((DAT_015bc46a != '\x01') ||
       (bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,IdleCollectPhase), !bVar4))
    goto LAB_007c9870;
    DVar5 = GetCurrentThreadId();
    pcVar9 = L"schedule finish";
    if (((bVar3 | this->hasScheduledIdleCollect) & 1U) != 0) {
      pcVar9 = L"reschedule finish";
    }
    Output::Print(L"%04X> Idle on exit collect %s\n",(ulong)DVar5,pcVar9);
  }
  else {
    this->needIdleCollect = true;
LAB_007c9729:
    DVar5 = GetTickCount();
    this->tickCountNextIdleCollection = DVar5 + 1000;
    if ((DAT_015bc46a != '\x01') ||
       (bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,IdleCollectPhase), !bVar4))
    goto LAB_007c9870;
    DVar5 = GetCurrentThreadId();
    pcVar9 = L"scheduled";
    if (bVar3 != false) {
      pcVar9 = L"rescheduled";
    }
    uVar1 = this->tickCountNextIdleCollection;
    DVar6 = GetTickCount();
    Output::Print(L"%04X> Idle on exit collect %s: %d\n",(ulong)DVar5,pcVar9,(ulong)(uVar1 - DVar6))
    ;
  }
  Output::Flush();
LAB_007c9870:
  if (this->inIdleCollect == true) {
    this->shouldScheduleIdleCollectOnExitIdle = true;
    return true;
  }
  bVar3 = ScheduleIdleCollect(this,1000,false);
  return bVar3;
}

Assistant:

bool ThreadServiceWrapperBase::ScheduleNextCollectOnExit()
{
    Assert(!threadContext->IsInScript());
    Assert(!needIdleCollect || hasScheduledIdleCollect);

    Recycler* recycler = threadContext->GetRecycler();
#if ENABLE_CONCURRENT_GC
    recycler->FinishConcurrent<FinishConcurrentOnExitScript>();
#endif

#ifdef RECYCLER_TRACE
    bool oldNeedIdleCollect = needIdleCollect;

    if (forceIdleCollectOnce)
    {
        IDLE_COLLECT_VERBOSE_TRACE(_u("Need to force one idle collection\n"));
    }
#endif

    needIdleCollect = forceIdleCollectOnce || recycler->ShouldIdleCollectOnExit();

    if (needIdleCollect)
    {
        // Set up when we will do the idle decommit
        tickCountNextIdleCollection = GetTickCount() + IdleTicks;

        IDLE_COLLECT_VERBOSE_TRACE(_u("Idle on exit collect %s: %d\n"), (oldNeedIdleCollect ? _u("rescheduled") : _u("scheduled")),
            tickCountNextIdleCollection - GetTickCount());

        JS_ETW(EventWriteJSCRIPT_GC_IDLE_SCHEDULED(this));
    }
    else
    {
        IDLE_COLLECT_VERBOSE_TRACE(_u("Idle on exit collect %s\n"), oldNeedIdleCollect ? _u("cancelled") : _u("not scheduled"));
        if (!recycler->CollectionInProgress())
        {
            // We collected and finished, no need to ensure the idle collect call back.
            return true;
        }

        IDLE_COLLECT_VERBOSE_TRACE(_u("Idle on exit collect %s\n"), hasScheduledIdleCollect || oldNeedIdleCollect ? _u("reschedule finish") : _u("schedule finish"));
    }

    // Don't schedule the call back if we are already in idle call back, as we don't do anything on recursive call anyways
    // IdleCollect will schedule one if necessary
    if (inIdleCollect)
    {
        shouldScheduleIdleCollectOnExitIdle = true;
        return true;
    }
    else
    {
        return ScheduleIdleCollect(IdleTicks, false /* not schedule as task */);
    }
}